

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
StringEqualNoCaseFailure::StringEqualNoCaseFailure
          (StringEqualNoCaseFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          char *expected,char *actual,SimpleString *text)

{
  char cVar1;
  char cVar2;
  undefined1 local_a8 [24];
  size_t failStartPrintable;
  size_t failStart;
  undefined1 local_78 [8];
  SimpleString printableActual;
  SimpleString printableExpected;
  char *local_38;
  char *actual_local;
  char *expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  StringEqualNoCaseFailure *this_local;
  
  local_38 = actual;
  actual_local = expected;
  expected_local = (char *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure =
       (_func_int **)&PTR__StringEqualNoCaseFailure_00368bd0;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb8,(SimpleString *)this);
  SimpleString::operator=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  PrintableStringFromOrNull((char *)&printableActual.bufferSize_);
  PrintableStringFromOrNull(local_78);
  TestFailure::createButWasString
            ((TestFailure *)&failStart,(SimpleString *)this,
             (SimpleString *)&printableActual.bufferSize_);
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)&failStart);
  SimpleString::~SimpleString((SimpleString *)&failStart);
  if ((actual_local != (char *)0x0) && (local_38 != (char *)0x0)) {
    failStartPrintable = 0;
    while( true ) {
      cVar1 = SimpleString::ToLower(local_38[failStartPrintable]);
      cVar2 = SimpleString::ToLower(actual_local[failStartPrintable]);
      if (cVar1 != cVar2) break;
      failStartPrintable = failStartPrintable + 1;
    }
    local_a8._16_8_ = 0;
    while( true ) {
      cVar1 = SimpleString::at((SimpleString *)local_78,local_a8._16_8_);
      cVar1 = SimpleString::ToLower(cVar1);
      cVar2 = SimpleString::at((SimpleString *)&printableActual.bufferSize_,local_a8._16_8_);
      cVar2 = SimpleString::ToLower(cVar2);
      if (cVar1 != cVar2) break;
      local_a8._16_8_ = local_a8._16_8_ + 1;
    }
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)local_a8,(SimpleString *)this,(size_t)local_78,local_a8._16_8_);
    SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_a8);
    SimpleString::~SimpleString((SimpleString *)local_a8);
  }
  SimpleString::~SimpleString((SimpleString *)local_78);
  SimpleString::~SimpleString((SimpleString *)&printableActual.bufferSize_);
  return;
}

Assistant:

StringEqualNoCaseFailure::StringEqualNoCaseFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString printableExpected = PrintableStringFromOrNull(expected);
    SimpleString printableActual = PrintableStringFromOrNull(actual);

    message_ += createButWasString(printableExpected, printableActual);
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; SimpleString::ToLower(actual[failStart]) == SimpleString::ToLower(expected[failStart]); failStart++)
            ;
        size_t failStartPrintable;
        for (failStartPrintable = 0;
             SimpleString::ToLower(printableActual.at(failStartPrintable)) == SimpleString::ToLower(printableExpected.at(failStartPrintable));
             failStartPrintable++)
            ;
        message_ += createDifferenceAtPosString(printableActual, failStartPrintable, failStart);
    }
}